

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O2

int wc_match_inner(char *wildcard,char *target,size_t target_len)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  char *target_end;
  char *target_local;
  char *local_30;
  
  target_end = target + target_len;
  cVar3 = '*';
  target_local = target;
  local_30 = wildcard;
  if (*wildcard != '*') {
    iVar4 = wc_match_fragment(&local_30,&target_local,target_end);
    if (iVar4 < 1) {
      return iVar4;
    }
    cVar3 = *local_30;
  }
  do {
    if (cVar3 != '*') {
      if (cVar3 == '\0') {
        return (uint)(target_local == target_end);
      }
      __assert_fail("*wildcard == \'*\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/wildcard.c"
                    ,0xe4,"int wc_match_inner(const char *, const char *, size_t)");
    }
    while (cVar3 == '*') {
      pcVar1 = local_30 + 1;
      local_30 = local_30 + 1;
      cVar3 = *pcVar1;
    }
    if (cVar3 == '\0') {
      return 1;
    }
    while( true ) {
      pcVar2 = local_30;
      pcVar1 = target_local;
      if (*target_local == '\0') {
        return 0;
      }
      iVar4 = wc_match_fragment(&local_30,&target_local,target_end);
      if (iVar4 < 0) {
        return iVar4;
      }
      if (iVar4 != 0) break;
      target_local = target_local + 1;
    }
    cVar3 = *local_30;
    if (target_local != target_end && cVar3 == '\0') {
      target_local = target_end + ((long)pcVar1 - (long)target_local);
      local_30 = pcVar2;
      iVar4 = wc_match_fragment(&local_30,&target_local,target_end);
      return iVar4;
    }
  } while( true );
}

Assistant:

static int wc_match_inner(
    const char *wildcard, const char *target, size_t target_len)
{
    const char *target_end = target + target_len;
    int ret;

    /*
     * Every time we see a '*' _followed_ by a fragment, we just
     * search along the string for a location at which the fragment
     * matches. The only special case is when we see a fragment
     * right at the start, in which case we just call the matching
     * routine once and give up if it fails.
     */
    if (*wildcard != '*') {
        ret = wc_match_fragment(&wildcard, &target, target_end);
        if (ret <= 0)
            return ret;                /* pass back failure or error alike */
    }

    while (*wildcard) {
        assert(*wildcard == '*');
        while (*wildcard == '*')
            wildcard++;

        /*
         * It's possible we've just hit the end of the wildcard
         * after seeing a *, in which case there's no need to
         * bother searching any more because we've won.
         */
        if (!*wildcard)
            return 1;

        /*
         * Now `wildcard' points at the next fragment. So we
         * attempt to match it against `target', and if that fails
         * we increment `target' and try again, and so on. When we
         * find we're about to try matching against the empty
         * string, we give up and return 0.
         */
        ret = 0;
        while (*target) {
            const char *save_w = wildcard, *save_t = target;

            ret = wc_match_fragment(&wildcard, &target, target_end);

            if (ret < 0)
                return ret;            /* syntax error */

            if (ret > 0 && !*wildcard && target != target_end) {
                /*
                 * Final special case - literally.
                 *
                 * This situation arises when we are matching a
                 * _terminal_ fragment of the wildcard (that is,
                 * there is nothing after it, e.g. "*a"), and it
                 * has matched _too early_. For example, matching
                 * "*a" against "parka" will match the "a" fragment
                 * against the _first_ a, and then (if it weren't
                 * for this special case) matching would fail
                 * because we're at the end of the wildcard but not
                 * at the end of the target string.
                 *
                 * In this case what we must do is measure the
                 * length of the fragment in the target (which is
                 * why we saved `target'), jump straight to that
                 * distance from the end of the string using
                 * strlen, and match the same fragment again there
                 * (which is why we saved `wildcard'). Then we
                 * return whatever that operation returns.
                 */
                target = target_end - (target - save_t);
                wildcard = save_w;
                return wc_match_fragment(&wildcard, &target, target_end);
            }

            if (ret > 0)
                break;
            target++;
        }
        if (ret > 0)
            continue;
        return 0;
    }

    /*
     * If we reach here, it must be because we successfully matched
     * a fragment and then found ourselves right at the end of the
     * wildcard. Hence, we return 1 if and only if we are also
     * right at the end of the target.
     */
    return target == target_end;
}